

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

box3f * __thiscall
pbrt::Curve::getPrimBounds(box3f *__return_storage_ptr__,Curve *this,size_t param_1,affine3f *xfm)

{
  pointer pvVar1;
  pointer pvVar2;
  vec3f vVar3;
  vec3f maxWidth;
  vec3f local_58;
  Curve *local_48;
  vec3f local_40;
  
  (__return_storage_ptr__->lower).x = 3.4028235e+38;
  (__return_storage_ptr__->lower).y = 3.4028235e+38;
  *(undefined8 *)&(__return_storage_ptr__->lower).z = 0xff7fffff7f7fffff;
  (__return_storage_ptr__->upper).y = -3.4028235e+38;
  (__return_storage_ptr__->upper).z = -3.4028235e+38;
  pvVar1 = (this->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_48 = this;
  for (pvVar2 = (this->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
                _M_impl.super__Vector_impl_data._M_start; pvVar2 != pvVar1; pvVar2 = pvVar2 + 1) {
    local_58.z = pvVar2->z;
    local_58.x = pvVar2->x;
    local_58.y = pvVar2->y;
    vVar3 = math::operator*(xfm,&local_58);
    local_40.z = vVar3.z;
    local_40._0_8_ = vVar3._0_8_;
    math::box3f::extend(__return_storage_ptr__,&local_40);
  }
  local_58.z = local_48->width1;
  if (local_48->width1 <= local_48->width0) {
    local_58.z = local_48->width0;
  }
  local_58.y = local_58.z;
  local_58.x = local_58.z;
  vVar3 = math::operator-(&__return_storage_ptr__->lower,&local_58);
  (__return_storage_ptr__->lower).x = (float)(int)vVar3._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)vVar3._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = vVar3.z;
  vVar3 = math::operator+(&__return_storage_ptr__->upper,&local_58);
  (__return_storage_ptr__->upper).x = (float)(int)vVar3._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)vVar3._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = vVar3.z;
  return __return_storage_ptr__;
}

Assistant:

box3f Curve::getPrimBounds(const size_t /*unused: primID*/, const affine3f &xfm) 
  {
    box3f primBounds = box3f::empty_box();
    for (auto p : P)
      primBounds.extend(xfmPoint(xfm,p));
    vec3f maxWidth = vec3f(std::max(width0,width1));
    primBounds.lower = primBounds.lower - maxWidth;
    primBounds.upper = primBounds.upper + maxWidth;
    return primBounds;
  }